

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alphabet.c
# Opt level: O0

void vrna_ptypes_prepare(vrna_fold_compound_t *fc,uint options)

{
  char **ppcVar1;
  char *pcVar2;
  uint options_local;
  vrna_fold_compound_t *fc_local;
  
  if (fc != (vrna_fold_compound_t *)0x0) {
    if (((options & 1) != 0) && (fc->type == VRNA_FC_TYPE_SINGLE)) {
      if ((options & 0x10) == 0) {
        if ((fc->field_23).field_0.ptype == (char *)0x0) {
          pcVar2 = vrna_ptypes((fc->field_23).field_0.sequence_encoding2,&fc->params->model_details)
          ;
          (fc->field_23).field_0.ptype = pcVar2;
        }
      }
      else {
        ppcVar1 = (char **)vrna_realloc(fc->ptype_local,(fc->length + 1) * 8);
        fc->ptype_local = ppcVar1;
      }
    }
    if (((options & 2) != 0) && (fc->type == VRNA_FC_TYPE_SINGLE)) {
      if ((options & 0x10) == 0) {
        if ((fc->field_23).field_0.ptype == (char *)0x0) {
          pcVar2 = vrna_ptypes((fc->field_23).field_0.sequence_encoding2,
                               &fc->exp_params->model_details);
          (fc->field_23).field_0.ptype = pcVar2;
        }
        if ((fc->field_23).field_0.ptype_pf_compat == (char *)0x0) {
          pcVar2 = get_ptypes((fc->field_23).field_0.sequence_encoding2,
                              &fc->exp_params->model_details,1);
          (fc->field_23).field_0.ptype_pf_compat = pcVar2;
        }
      }
      else {
        ppcVar1 = (char **)vrna_realloc(fc->ptype_local,(fc->length + 1) * 8);
        fc->ptype_local = ppcVar1;
      }
    }
  }
  return;
}

Assistant:

PUBLIC void
vrna_ptypes_prepare(vrna_fold_compound_t  *fc,
                    unsigned int          options)
{
  if (!fc)
    return;

  if (options & VRNA_OPTION_MFE) {
    switch (fc->type) {
      case VRNA_FC_TYPE_SINGLE:
        if (options & VRNA_OPTION_WINDOW) {
          fc->ptype_local =
            (char **)vrna_realloc(fc->ptype_local, sizeof(char *) * (fc->length + 1));
        } else {
          if (!fc->ptype)
            fc->ptype = vrna_ptypes(fc->sequence_encoding2,
                                    &(fc->params->model_details));
        }

        break;

      case VRNA_FC_TYPE_COMPARATIVE:
        break;

      default:
        break;
    }
  }

  if (options & VRNA_OPTION_PF) {
    switch (fc->type) {
      case VRNA_FC_TYPE_SINGLE:
        if (options & VRNA_OPTION_WINDOW) {
          fc->ptype_local =
            (char **)vrna_realloc(fc->ptype_local, sizeof(char *) * (fc->length + 1));
        } else {
          if (!fc->ptype)
            fc->ptype = vrna_ptypes(fc->sequence_encoding2, &(fc->exp_params->model_details));

#ifndef VRNA_DISABLE_BACKWARD_COMPATIBILITY
          /* backward compatibility ptypes */
          if (!fc->ptype_pf_compat)
            fc->ptype_pf_compat = get_ptypes(fc->sequence_encoding2,
                                             &(fc->exp_params->model_details),
                                             1);

#endif
        }

        break;

      case VRNA_FC_TYPE_COMPARATIVE:
        break;

      default:
        break;
    }
  }
}